

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O0

void * lzham::lzham_malloc(size_t size,size_t *pActual_size)

{
  ulong *in_RSI;
  long in_RDI;
  uint8 *p_new;
  size_t actual_size;
  ulong local_20;
  ulong *local_18;
  ulong local_10;
  void *local_8;
  
  local_10 = in_RDI + 3U & 0xfffffffffffffffc;
  if (local_10 == 0) {
    local_10 = 4;
  }
  if (local_10 < 0x400000001) {
    local_20 = local_10;
    local_18 = in_RSI;
    local_8 = (void *)(*(code *)g_pRealloc)(0,local_10,&local_20,1,g_pUser_data);
    if (local_18 != (ulong *)0x0) {
      *local_18 = local_20;
    }
    if ((local_8 == (void *)0x0) || (local_20 < local_10)) {
      lzham_mem_error((char *)0x134002);
      local_8 = (void *)0x0;
    }
  }
  else {
    lzham_mem_error((char *)0x133f92);
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void* lzham_malloc(size_t size, size_t* pActual_size)
   {
      size = (size + sizeof(uint32) - 1U) & ~(sizeof(uint32) - 1U);
      if (!size)
         size = sizeof(uint32);

      if (size > MAX_POSSIBLE_BLOCK_SIZE)
      {
         lzham_mem_error("lzham_malloc: size too big");
         return NULL;
      }

      size_t actual_size = size;
      uint8* p_new = static_cast<uint8*>((*g_pRealloc)(NULL, size, &actual_size, true, g_pUser_data));

      if (pActual_size)
         *pActual_size = actual_size;

      if ((!p_new) || (actual_size < size))
      {
         lzham_mem_error("lzham_malloc: out of memory");
         return NULL;
      }

      LZHAM_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if LZHAM_MEM_STATS
      update_total_allocated(1, static_cast<mem_stat_t>(actual_size));
#endif

      return p_new;
   }